

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestMap_Test::
~ConvertDescriptorToTypeTest_TestMap_Test(ConvertDescriptorToTypeTest_TestMap_Test *this)

{
  ConvertDescriptorToTypeTest_TestMap_Test *this_local;
  
  ~ConvertDescriptorToTypeTest_TestMap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestMap) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix, *proto2_unittest::TestMap::GetDescriptor());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE,
                       "map_int32_int32", 1));
  EXPECT_TRUE(CheckFieldTypeUrl(
      type, "map_int32_int32",
      GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry")));
}